

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BitsToFloatCaseInstance::getInputValues
          (BitsToFloatCaseInstance *this,int numValues,void **values)

{
  deUint32 dVar1;
  int iVar2;
  int in_ECX;
  Random rnd;
  deRandom local_30;
  
  dVar1 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_30,dVar1 ^ 0xbbb225);
  iVar2 = glu::getDataTypeScalarSize
                    ((((this->super_CommonFunctionTestInstance).m_spec.inputs.
                       super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  fillRandomScalars<float>((Random *)&local_30,-1e+08,1e+08,*values,numValues * iVar2,in_ECX);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(m_name) ^ 0xbbb225u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);
		const Vec2				range		(-1e8f, +1e8f);

		// \note Filled as floats.
		fillRandomScalars(rnd, range.x(), range.y(), values[0], numValues*scalarSize);
	}